

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

void finish(ect *e)

{
  void *__ptr;
  uint *__ptr_00;
  unsigned_long *puVar1;
  direction *__ptr_01;
  bool *__ptr_02;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  v_array<v_array<unsigned_int>_> *pvVar5;
  v_array<unsigned_int> *__ptr_03;
  undefined8 *puVar6;
  
  pvVar5 = (e->all_levels)._begin;
  if ((e->all_levels)._end != pvVar5) {
    uVar3 = 0;
    do {
      __ptr_03 = pvVar5[uVar3]._begin;
      if (pvVar5[uVar3]._end != __ptr_03) {
        lVar2 = 0;
        uVar4 = 0;
        do {
          __ptr = *(void **)((long)&__ptr_03->_begin + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          puVar6 = (undefined8 *)((long)&__ptr_03->_begin + lVar2);
          *puVar6 = 0;
          puVar6[1] = 0;
          puVar6[2] = 0;
          uVar4 = uVar4 + 1;
          pvVar5 = (e->all_levels)._begin;
          __ptr_03 = pvVar5[uVar3]._begin;
          lVar2 = lVar2 + 0x20;
        } while (uVar4 < (ulong)((long)pvVar5[uVar3]._end - (long)__ptr_03 >> 5));
      }
      pvVar5 = pvVar5 + uVar3;
      if (__ptr_03 != (v_array<unsigned_int> *)0x0) {
        free(__ptr_03);
      }
      pvVar5->_begin = (v_array<unsigned_int> *)0x0;
      pvVar5->_end = (v_array<unsigned_int> *)0x0;
      pvVar5->end_array = (v_array<unsigned_int> *)0x0;
      uVar3 = uVar3 + 1;
      pvVar5 = (e->all_levels)._begin;
    } while (uVar3 < (ulong)((long)(e->all_levels)._end - (long)pvVar5 >> 5));
  }
  if (pvVar5 != (v_array<v_array<unsigned_int>_> *)0x0) {
    free(pvVar5);
  }
  (e->all_levels)._begin = (v_array<v_array<unsigned_int>_> *)0x0;
  (e->all_levels)._end = (v_array<v_array<unsigned_int>_> *)0x0;
  (e->all_levels).end_array = (v_array<v_array<unsigned_int>_> *)0x0;
  __ptr_00 = (e->final_nodes)._begin;
  if (__ptr_00 != (uint *)0x0) {
    free(__ptr_00);
  }
  (e->final_nodes)._begin = (uint *)0x0;
  (e->final_nodes)._end = (uint *)0x0;
  (e->final_nodes).end_array = (uint *)0x0;
  puVar1 = (e->up_directions)._begin;
  if (puVar1 != (unsigned_long *)0x0) {
    free(puVar1);
  }
  (e->up_directions)._begin = (unsigned_long *)0x0;
  (e->up_directions)._end = (unsigned_long *)0x0;
  (e->up_directions).end_array = (unsigned_long *)0x0;
  __ptr_01 = (e->directions)._begin;
  if (__ptr_01 != (direction *)0x0) {
    free(__ptr_01);
  }
  (e->directions)._begin = (direction *)0x0;
  (e->directions)._end = (direction *)0x0;
  (e->directions).end_array = (direction *)0x0;
  puVar1 = (e->down_directions)._begin;
  if (puVar1 != (unsigned_long *)0x0) {
    free(puVar1);
  }
  (e->down_directions)._begin = (unsigned_long *)0x0;
  (e->down_directions)._end = (unsigned_long *)0x0;
  (e->down_directions).end_array = (unsigned_long *)0x0;
  __ptr_02 = (e->tournaments_won)._begin;
  if (__ptr_02 != (bool *)0x0) {
    free(__ptr_02);
  }
  (e->tournaments_won)._begin = (bool *)0x0;
  (e->tournaments_won)._end = (bool *)0x0;
  (e->tournaments_won).end_array = (bool *)0x0;
  return;
}

Assistant:

void finish(ect& e)
{
  for (size_t l = 0; l < e.all_levels.size(); l++)
  {
    for (size_t t = 0; t < e.all_levels[l].size(); t++) e.all_levels[l][t].delete_v();
    e.all_levels[l].delete_v();
  }
  e.all_levels.delete_v();
  e.final_nodes.delete_v();
  e.up_directions.delete_v();
  e.directions.delete_v();
  e.down_directions.delete_v();
  e.tournaments_won.delete_v();
}